

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O0

void Gia_GlaProveAbsracted(Gia_Man_t *pGia,int fSimpProver,int fVerbose)

{
  int iVar1;
  int status;
  pthread_t ProverThread;
  Gia_Man_t *pAbs;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig;
  Ssw_Pars_t *pPars;
  Ssw_Pars_t Pars;
  Abs_ThData_t *pThData;
  int fVerbose_local;
  int fSimpProver_local;
  Gia_Man_t *pGia_local;
  
  pAig = (Aig_Man_t *)&pPars;
  if (pGia->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0x90,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  ProverThread = (pthread_t)Gia_ManDupAbsGates(pGia,pGia->vGateClasses);
  Gia_ManCleanValue(pGia);
  pTemp = Gia_ManToAigSimple((Gia_Man_t *)ProverThread);
  Gia_ManStop((Gia_Man_t *)ProverThread);
  if (fSimpProver != 0) {
    Ssw_ManSetDefaultParams((Ssw_Pars_t *)pAig);
    *(undefined4 *)&pAig->pSpec = 4;
    pAbs = (Gia_Man_t *)pTemp;
    pTemp = Ssw_SignalCorrespondence(pTemp,(Ssw_Pars_t *)pAig);
    Aig_ManStop((Aig_Man_t *)pAbs);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
  if (iVar1 != 0) {
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xa4,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  g_fAbstractionProved = 0;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
  if (iVar1 != 0) {
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xa6,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  Pars.pFunc = calloc(1,0x10);
  *(Aig_Man_t **)Pars.pFunc = pTemp;
  *(int *)((long)Pars.pFunc + 8) = fVerbose;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
  if (iVar1 == 0) {
    g_nRunIds = g_nRunIds + 1;
    *(int *)((long)Pars.pFunc + 0xc) = g_nRunIds;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                    ,0xad,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
    }
    if (fVerbose != 0) {
      Abc_Print(1,"\nTrying to prove abstraction %d.\n",(ulong)*(uint *)((long)Pars.pFunc + 0xc));
    }
    iVar1 = pthread_create((pthread_t *)&stack0xffffffffffffff10,(pthread_attr_t *)0x0,
                           Abs_ProverThread,Pars.pFunc);
    if (iVar1 == 0) {
      return;
    }
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xb1,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                ,0xab,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_GlaProveAbsracted( Gia_Man_t * pGia, int fSimpProver, int fVerbose )
{
    extern Aig_Man_t * Dar_ManRwsat( Aig_Man_t * pAig, int fBalance, int fVerbose );
    Abs_ThData_t * pThData;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pAig, * pTemp;
    Gia_Man_t * pAbs;
    pthread_t ProverThread;
    int status;
    // disable verbosity
//    fVerbose = 0;
    // create abstraction 
    assert( pGia->vGateClasses != NULL );
    pAbs = Gia_ManDupAbsGates( pGia, pGia->vGateClasses );
    Gia_ManCleanValue( pGia );
    pAig = Gia_ManToAigSimple( pAbs );
    Gia_ManStop( pAbs );
    // simplify abstraction
    if ( fSimpProver )
    {
        Ssw_ManSetDefaultParams( pPars );
        pPars->nFramesK = 4;
        pAig = Ssw_SignalCorrespondence( pTemp = pAig, pPars );
//printf( "\n" );
//Aig_ManPrintStats( pTemp );
//Aig_ManPrintStats( pAig );
        Aig_ManStop( pTemp );
    }
    // synthesize abstraction
//    pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 ); 
//    Aig_ManStop( pTemp );
    // reset the proof 
    status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
    g_fAbstractionProved = 0;
    status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    // collect thread data
    pThData = ABC_CALLOC( Abs_ThData_t, 1 );
    pThData->pAig = pAig;
    pThData->fVerbose = fVerbose;
    status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
    pThData->RunId = ++g_nRunIds;
    status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    // create thread
    if ( fVerbose )  Abc_Print( 1, "\nTrying to prove abstraction %d.\n", pThData->RunId );
    status = pthread_create( &ProverThread, NULL, Abs_ProverThread, pThData );
    assert( status == 0 );
}